

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O0

ExecutionResult __thiscall
nigel::BuilderTask::execute
          (BuilderTask *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *parameters,set<char,_std::less<char>,_std::allocator<char>_> *flags)

{
  bool bVar1;
  mapped_type *pmVar2;
  element_type *lhs;
  element_type *rhs;
  reference psVar3;
  element_type *peVar4;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *plVar5;
  double __x;
  bool local_431;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  local_3b8;
  _List_node_base *local_3a0;
  _List_node_base *local_398;
  _List_const_iterator<std::shared_ptr<nigel::CompileNotification>_> local_390;
  iterator local_388;
  const_iterator local_380;
  ExecutionResult local_374;
  undefined1 local_370 [4];
  ExecutionResult result;
  shared_ptr<nigel::BuilderExecutable> e;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  *__range1;
  undefined1 local_340 [4];
  ExecutionResult executionResult;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  notificationList;
  allocator local_319;
  key_type local_318;
  _Self local_2f8;
  _Self local_2f0;
  allocator local_2e1;
  key_type local_2e0;
  _Self local_2c0;
  _Self local_2b8;
  allocator local_2a9;
  key_type local_2a8;
  _Self local_288;
  _Self local_280;
  allocator local_271;
  key_type local_270;
  _Self local_250;
  int local_248;
  allocator local_241;
  string local_240 [32];
  _Self local_220;
  byte local_213;
  byte local_212;
  allocator local_211;
  key_type local_210;
  _Self local_1f0;
  allocator local_1e1;
  key_type local_1e0;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  key_type local_1a0;
  _Self local_180;
  allocator local_171;
  key_type local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator local_121;
  key_type local_120;
  _Self local_100;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f8;
  time_point startTime;
  CodeBase codeBase;
  set<char,_std::less<char>,_std::allocator<char>_> *flags_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *parameters_local;
  BuilderTask *this_local;
  
  codeBase.hexBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)flags;
  CodeBase::CodeBase((CodeBase *)&startTime);
  local_f8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"c",&local_121);
  local_100._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::find(parameters,&local_120);
  local_150.field_2._M_allocated_capacity =
       (size_type)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end(parameters);
  bVar1 = std::operator!=(&local_100,(_Self *)&local_150.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"c",&local_171);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](parameters,&local_170);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front(pmVar2);
    std::make_shared<boost::filesystem::path,std::__cxx11::string&>(&local_150);
    std::shared_ptr<boost::filesystem::path>::operator=
              ((shared_ptr<boost::filesystem::path> *)&startTime,
               (shared_ptr<boost::filesystem::path> *)&local_150);
    std::shared_ptr<boost::filesystem::path>::~shared_ptr
              ((shared_ptr<boost::filesystem::path> *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"o",(allocator *)(local_1b0 + 0xf));
  local_180._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::find(parameters,&local_1a0);
  local_1b0._0_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end(parameters);
  bVar1 = std::operator!=(&local_180,(_Self *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)(local_1b0 + 0xf));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"o",&local_1e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](parameters,&local_1e0);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front(pmVar2);
    std::make_shared<boost::filesystem::path,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
    std::shared_ptr<boost::filesystem::path>::operator=
              ((shared_ptr<boost::filesystem::path> *)
               &codeBase.srcFile.
                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<boost::filesystem::path> *)local_1c0);
    std::shared_ptr<boost::filesystem::path>::~shared_ptr
              ((shared_ptr<boost::filesystem::path> *)local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  lhs = std::__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&startTime);
  rhs = std::__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&codeBase.srcFile.
                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
  local_212 = 0;
  local_213 = 0;
  bVar1 = boost::filesystem::operator==(lhs,rhs);
  local_431 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_212 = 1;
    std::__cxx11::string::string((string *)&local_210,"overwritecode",&local_211);
    local_213 = 1;
    local_1f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::find(parameters,&local_210);
    local_220._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::end(parameters);
    local_431 = std::operator==(&local_1f0,&local_220);
  }
  if ((local_213 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_210);
  }
  if ((local_212 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  if (local_431 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"pl",&local_271);
    local_250._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::find(parameters,&local_270);
    local_280._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::end(parameters);
    bVar1 = std::operator!=(&local_250,&local_280);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    if (bVar1) {
      codeBase.destFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_1_ = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"pa",&local_2a9);
    local_288._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::find(parameters,&local_2a8);
    local_2b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::end(parameters);
    bVar1 = std::operator!=(&local_288,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    if (bVar1) {
      codeBase.destFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._5_1_ = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,"pi",&local_2e1);
    local_2c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::find(parameters,&local_2e0);
    local_2f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::end(parameters);
    bVar1 = std::operator!=(&local_2c0,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    if (bVar1) {
      codeBase.destFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._6_1_ = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"pasm",&local_319);
    local_2f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::find(parameters,&local_318);
    notificationList.
    super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ._M_impl._M_node._M_size =
         (size_t)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::end(parameters);
    bVar1 = std::operator!=(&local_2f8,
                            (_Self *)&notificationList.
                                      super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                                      ._M_impl._M_node._M_size);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    if (bVar1) {
      codeBase.destFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 1;
    }
    std::__cxx11::
    list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ::list((list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
            *)local_340);
    __range1._4_4_ = success;
    __end1 = std::__cxx11::
             list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
             ::begin(&this->executables);
    e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::
         list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
         ::end(&this->executables);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&e.
                                                  super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
      psVar3 = std::_List_iterator<std::shared_ptr<nigel::BuilderExecutable>_>::operator*(&__end1);
      std::shared_ptr<nigel::BuilderExecutable>::shared_ptr
                ((shared_ptr<nigel::BuilderExecutable> *)local_370,psVar3);
      peVar4 = std::
               __shared_ptr_access<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_370);
      local_374 = (*peVar4->_vptr_BuilderExecutable[2])(peVar4,&startTime);
      local_388._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
           ::end((list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                  *)local_340);
      std::_List_const_iterator<std::shared_ptr<nigel::CompileNotification>_>::_List_const_iterator
                (&local_380,&local_388);
      peVar4 = std::
               __shared_ptr_access<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_370);
      plVar5 = BuilderExecutable::getNotifications_abi_cxx11_(peVar4);
      local_390._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
           ::begin(plVar5);
      peVar4 = std::
               __shared_ptr_access<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_370);
      plVar5 = BuilderExecutable::getNotifications_abi_cxx11_(peVar4);
      local_398 = (_List_node_base *)
                  std::__cxx11::
                  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                  ::end(plVar5);
      local_3a0 = (_List_node_base *)
                  std::__cxx11::
                  list<std::shared_ptr<nigel::CompileNotification>,std::allocator<std::shared_ptr<nigel::CompileNotification>>>
                  ::
                  insert<std::_List_const_iterator<std::shared_ptr<nigel::CompileNotification>>,void>
                            ((list<std::shared_ptr<nigel::CompileNotification>,std::allocator<std::shared_ptr<nigel::CompileNotification>>>
                              *)local_340,local_380,local_390,
                             (_List_const_iterator<std::shared_ptr<nigel::CompileNotification>_>)
                             local_398);
      if (local_374 == success) {
        local_248 = 0;
      }
      else {
        __range1._4_4_ = local_374;
        local_248 = 2;
      }
      std::shared_ptr<nigel::BuilderExecutable>::~shared_ptr
                ((shared_ptr<nigel::BuilderExecutable> *)local_370);
      if (local_248 != 0) break;
      std::_List_iterator<std::shared_ptr<nigel::BuilderExecutable>_>::operator++(&__end1);
    }
    std::__cxx11::
    list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ::list(&local_3b8,
           (list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
            *)local_340);
    printErrorLog(this,&local_3b8,local_f8);
    std::__cxx11::
    list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ::~list(&local_3b8);
    this_local._4_4_ = __range1._4_4_;
    local_248 = 1;
    std::__cxx11::
    list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ::~list((list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
             *)local_340);
  }
  else {
    std::allocator<char>::allocator();
    __x = (double)std::__cxx11::string::string
                            (local_240,
                             "Warning: you attempt to overwrite your source code! Take --overwritecode as parameter to proceed."
                             ,&local_241);
    helper::log((helper *)local_240,__x);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    this_local._4_4_ = parameterError;
    local_248 = 1;
  }
  CodeBase::~CodeBase((CodeBase *)&startTime);
  return this_local._4_4_;
}

Assistant:

ExecutionResult BuilderTask::execute( std::map<String, std::list<String>> parameters, std::set<char> flags )
	{
		CodeBase codeBase;
		auto startTime = std::chrono::system_clock::now();

		if( parameters.find( "c" ) != parameters.end() ) codeBase.srcFile = std::make_shared<fs::path>( parameters["c"].front() );
		if( parameters.find( "o" ) != parameters.end() ) codeBase.destFile = std::make_shared<fs::path>( parameters["o"].front() );
		if( *codeBase.srcFile == *codeBase.destFile && parameters.find( "overwritecode" ) == parameters.end() )
		{
			log( "Warning: you attempt to overwrite your source code! Take --overwritecode as parameter to proceed.", LogLevel::Warning );
			return ExecutionResult::parameterError;
		}

		if( parameters.find( "pl" ) != parameters.end() ) codeBase.printLexer = true;
		if( parameters.find( "pa" ) != parameters.end() ) codeBase.printAST = true;
		if( parameters.find( "pi" ) != parameters.end() ) codeBase.printIMC = true;
		if( parameters.find( "pasm" ) != parameters.end() ) codeBase.printAssembly = true;

		std::list<std::shared_ptr<CompileNotification>> notificationList;
		ExecutionResult executionResult = ExecutionResult::success;

		for( auto e : executables )
		{
			ExecutionResult result = e->onExecute( codeBase );
			notificationList.insert( notificationList.end(), e->getNotifications().begin(), e->getNotifications().end() );
			if( result != ExecutionResult::success )
			{
				executionResult = result;
				break;
			}
		}

		printErrorLog( notificationList, startTime );
		return executionResult;
	}